

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRSDA.cpp
# Opt level: O2

void __thiscall chrono::ChLinkRSDA::CalcAngle(ChLinkRSDA *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ChVector<double> f2;
  ChVector<double> g1;
  ChVector<double> f1;
  ChQuaternion<double> rot2;
  ChQuaternion<double> rot1;
  ChVector<double> local_e8;
  ChVector<double> local_d0;
  ulong local_b8;
  double local_b0;
  ulong local_a8;
  ulong local_a0;
  double local_98;
  ulong local_90;
  ulong local_88;
  double local_80;
  ulong local_78;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  ChQuaternion<double>::operator*
            (&local_50,
             &(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
              coord.rot,&(this->m_csys1).rot);
  ChQuaternion<double>::operator*
            (&local_70,
             &(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
              coord.rot,&(this->m_csys2).rot);
  ChQuaternion<double>::GetXaxis(&local_50);
  ChQuaternion<double>::GetYaxis(&local_50);
  ChQuaternion<double>::GetXaxis(&local_70);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_b8;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_a8;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_a0;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_b0 * local_98;
  auVar1 = vfmadd231sd_fma(auVar13,auVar19,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_88;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_b0 * local_80;
  auVar2 = vfmadd231sd_fma(auVar15,auVar19,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_90;
  auVar1 = vfmadd231sd_fma(auVar1,auVar17,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_78;
  auVar2 = vfmadd231sd_fma(auVar2,auVar17,auVar4);
  dVar12 = asin(auVar1._0_8_);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = auVar1._0_8_;
  uVar9 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar5,2);
  bVar11 = (bool)((byte)uVar9 & 1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar2._0_8_;
  uVar9 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar6,6);
  bVar10 = (bool)((byte)uVar9 & 1);
  this->m_angle =
       (double)((ulong)bVar10 *
                (long)((double)((ulong)bVar11 * 0x400921fb54442d18 +
                               (ulong)!bVar11 * -0x3ff6de04abbbd2e8) - dVar12) +
               (ulong)!bVar10 * (long)dVar12);
  ChQuaternion<double>::GetZaxis(&local_50);
  if (&local_e8 != &this->m_axis) {
    (this->m_axis).m_data[0] = local_e8.m_data[0];
    (this->m_axis).m_data[1] = local_e8.m_data[1];
    (this->m_axis).m_data[2] = local_e8.m_data[2];
  }
  ChFrameMoving<double>::GetWvel_par
            (&local_e8,&((this->super_ChLink).Body2)->super_ChFrameMoving<double>);
  ChFrameMoving<double>::GetWvel_par
            (&local_d0,&((this->super_ChLink).Body1)->super_ChFrameMoving<double>);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (this->m_axis).m_data[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_e8.m_data[0] - local_d0.m_data[0];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (local_e8.m_data[1] - local_d0.m_data[1]) * (this->m_axis).m_data[1];
  auVar1 = vfmadd231sd_fma(auVar16,auVar14,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (this->m_axis).m_data[2];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_e8.m_data[2] - local_d0.m_data[2];
  auVar1 = vfmadd231sd_fma(auVar1,auVar18,auVar8);
  this->m_angle_dt = auVar1._0_8_;
  return;
}

Assistant:

void ChLinkRSDA::CalcAngle() {
    // Express the RSDA frames in absolute frame
    ChQuaternion<> rot1 = Body1->GetRot() * m_csys1.rot;
    ChQuaternion<> rot2 = Body2->GetRot() * m_csys2.rot;

    // Extract unit vectors
    auto f1 = rot1.GetXaxis();
    auto g1 = rot1.GetYaxis();
    auto f2 = rot2.GetXaxis();

    // Calculate sine and cosine of rotation angle
    double s = Vdot(g1, f2);
    double c = Vdot(f1, f2);

    // Get angle (in [-pi , +pi])
    double a = std::asin(s);
    if (c >= 0) {
        m_angle = a;
    } else {
        m_angle = (s >= 0) ? CH_C_PI - a : -CH_C_PI - a;
    }

    // Get angle rate of change
    m_axis = rot1.GetZaxis();
    m_angle_dt = Vdot(m_axis, Body2->GetWvel_par() - Body1->GetWvel_par());
}